

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepEdge.h
# Opt level: O0

void anurbs::BrepEdge::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  char *name_00;
  class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *pcVar1;
  arg aVar2;
  undefined1 local_c0;
  arg local_b8;
  code *local_a8;
  undefined8 local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  handle local_48;
  class_<anurbs::BrepEdge,_std::shared_ptr<anurbs::BrepEdge>_> local_40;
  string local_38 [8];
  string name;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_local;
  module *m_local;
  
  name.field_2._8_8_ = model;
  python_name_abi_cxx11_();
  local_48.m_ptr = (m->super_object).super_handle.m_ptr;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::BrepEdge,_std::shared_ptr<anurbs::BrepEdge>_>::class_<>
            (&local_40,local_48,name_00);
  local_68 = faces;
  local_60 = 0;
  pcVar1 = (class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *)
           pybind11::class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>::
           def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepFace>,std::allocator<anurbs::Ref<anurbs::BrepFace>>>(anurbs::BrepEdge::*)()const>
                     ((class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *)&local_40,
                      "faces",(offset_in_Model_to_subr *)&local_68);
  local_78 = loops;
  local_70 = 0;
  pcVar1 = (class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *)
           pybind11::class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>::
           def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepLoop>,std::allocator<anurbs::Ref<anurbs::BrepLoop>>>(anurbs::BrepEdge::*)()const>
                     (pcVar1,"loops",(offset_in_Model_to_subr *)&local_78);
  local_88 = nb_trims;
  local_80 = 0;
  pcVar1 = (class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *)
           pybind11::class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>::
           def_property_readonly<unsigned_long(anurbs::BrepEdge::*)()const>
                     (pcVar1,"nb_trims",(offset_in_Model_to_subr *)&local_88);
  local_98 = trims;
  local_90 = 0;
  pcVar1 = (class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>> *)
           pybind11::class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>::
           def_property_readonly<std::vector<anurbs::Ref<anurbs::BrepTrim>,std::allocator<anurbs::Ref<anurbs::BrepTrim>>>(anurbs::BrepEdge::*)()const>
                     (pcVar1,"trims",(offset_in_Model_to_subr *)&local_98);
  local_a8 = trim;
  local_a0 = 0;
  aVar2 = pybind11::literals::operator____a("index",5);
  local_b8.name = aVar2.name;
  local_c0 = aVar2._8_1_;
  local_b8._8_1_ = local_c0;
  pybind11::class_<anurbs::BrepEdge,std::shared_ptr<anurbs::BrepEdge>>::
  def<anurbs::Ref<anurbs::BrepTrim>(anurbs::BrepEdge::*)(unsigned_long)const,pybind11::arg>
            (pcVar1,"trim",(offset_in_Model_to_subr *)&local_a8,&local_b8);
  pybind11::class_<anurbs::BrepEdge,_std::shared_ptr<anurbs::BrepEdge>_>::~class_(&local_40);
  Model::register_python_data_type<anurbs::BrepEdge>
            (m,(class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)name.field_2._8_8_);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = BrepEdge;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // read-only properties
            .def_property_readonly("faces", &Type::faces)
            .def_property_readonly("loops", &Type::loops)
            .def_property_readonly("nb_trims", &Type::nb_trims)
            .def_property_readonly("trims", &Type::trims)
            // methods
            .def("trim", &Type::trim, "index"_a)
        ;

        Model::register_python_data_type<Type>(m, model);
    }